

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O0

ssize_t __thiscall MetaSim::TableOutput::write(TableOutput *this,int __fd,void *__buf,size_t __n)

{
  undefined8 uVar1;
  ostream *poVar2;
  reference ppBVar3;
  _List_const_iterator<MetaSim::BaseStat_*> *this_00;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  string *psVar5;
  double dVar6;
  BaseStat *p;
  const_iterator i;
  ofstream f;
  BaseStat *in_stack_fffffffffffffcb8;
  _List_const_iterator<MetaSim::BaseStat_*> *in_stack_fffffffffffffcc0;
  string local_2c8 [32];
  BaseStat *local_2a8;
  _List_const_iterator<MetaSim::BaseStat_*> local_2a0;
  ostream local_298 [184];
  BaseStat *in_stack_fffffffffffffe20;
  CONFIDENCE_INTERVAL in_stack_fffffffffffffeac;
  BaseStat *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  BaseExc *in_stack_fffffffffffffed0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  TableOutput *local_8;
  
  psVar5 = (string *)CONCAT44(in_register_00000034,__fd);
  local_10 = psVar5;
  local_8 = this;
  if ((_created & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Init function not called",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"TableOutput",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"basestat.cpp",&local_91);
    BaseExc::BaseExc(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8);
    __cxa_throw(uVar1,&BaseExc::typeinfo,BaseExc::~BaseExc);
  }
  uVar1 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_298,uVar1,0x10);
  poVar2 = std::operator<<(local_298,psVar5);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_2a0._M_node = (_List_node_base *)BaseStat::begin();
  ppBVar3 = std::_List_const_iterator<MetaSim::BaseStat_*>::operator*(in_stack_fffffffffffffcc0);
  local_2a8 = *ppBVar3;
  while (local_2a8 != (BaseStat *)0x0) {
    BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffcb8);
    poVar2 = std::operator<<(local_298,local_2c8);
    poVar2 = std::operator<<(poVar2,"\t\t | ");
    dVar6 = BaseStat::getMean(in_stack_fffffffffffffe20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
    poVar2 = std::operator<<(poVar2,"\t\t | ");
    dVar6 = BaseStat::getConfInterval(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    this_00 = (_List_const_iterator<MetaSim::BaseStat_*> *)std::ostream::operator<<(poVar2,dVar6);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2c8);
    std::_List_const_iterator<MetaSim::BaseStat_*>::operator++(&local_2a0);
    ppBVar3 = std::_List_const_iterator<MetaSim::BaseStat_*>::operator*(this_00);
    local_2a8 = *ppBVar3;
  }
  sVar4 = std::ofstream::~ofstream(local_298);
  return sVar4;
}

Assistant:

void TableOutput::write(string message)
    {

        if (!_created) 
            throw BaseExc("Init function not called",
                          "TableOutput",
                          "basestat.cpp");

        ofstream f(_fname.c_str());
        f << message << endl;

        BaseStat::List::const_iterator i  = BaseStat::begin();
        BaseStat* p = *i;
        while (p != NULL) {
            f << p->getName() << "\t\t | "
              << p->getMean() << "\t\t | "
              << p->getConfInterval() << endl;
            ++i;
            p = *i;
        }
    }